

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O2

Mvc_Cover_t * Mvc_CoverCreateTautology(Mvc_Cover_t *pCover)

{
  int *piVar1;
  uint uVar2;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar3;
  byte bVar4;
  Mvc_Cube_t *pMVar5;
  ulong uVar6;
  uint uVar7;
  
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pMVar3 = Mvc_CubeAlloc(pCover_00);
  uVar2 = *(uint *)&pMVar3->field_0x8;
  uVar7 = uVar2 & 0xffffff;
  bVar4 = (byte)(uVar2 >> 0x18);
  if ((ulong)uVar7 == 1) {
    pMVar3->pData[0] = 0xffffffff;
    *(uint *)&pMVar3->field_0x14 = 0xffffffff >> (bVar4 & 0x1f);
  }
  else if (uVar7 == 0) {
    pMVar3->pData[0] = 0xffffffff >> (bVar4 & 0x1f);
  }
  else {
    pMVar3->pData[uVar7] = 0xffffffff >> (bVar4 & 0x1f);
    for (uVar6 = (ulong)(uVar2 & 0xffffff); 0 < (long)uVar6; uVar6 = uVar6 - 1) {
      pMVar3->pData[uVar6 - 1] = 0xffffffff;
    }
  }
  if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar5 = (Mvc_Cube_t *)&pCover_00->lCubes;
  }
  else {
    pMVar5 = (pCover_00->lCubes).pTail;
  }
  pMVar5->pNext = pMVar3;
  (pCover_00->lCubes).pTail = pMVar3;
  pMVar3->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover_00->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverCreateTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCubeNew;
    Mvc_Cover_t * pCoverNew;
    pCoverNew = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pCubeNew = Mvc_CubeAlloc( pCoverNew );
    Mvc_CubeBitFill( pCubeNew );
    Mvc_CoverAddCubeTail( pCoverNew, pCubeNew );
    return pCoverNew;
}